

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  BrotliEncoderState *params;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  size_t sVar7;
  uint32_t *puVar8;
  uint8_t *puVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  int local_14a0;
  int local_149c;
  size_t local_1470;
  ulong local_1460;
  ulong local_1450;
  size_t local_1448;
  size_t local_1440;
  void *local_1420;
  int local_1410;
  int local_140c;
  int local_1408;
  bool local_1401;
  void *local_1400;
  ulong local_13f0;
  size_t storage_ix_1;
  uint8_t *storage_1;
  uint local_13d8;
  uint32_t metablock_size;
  int should_flush;
  int next_input_fits_metablock;
  size_t processed_bytes;
  size_t max_commands;
  size_t max_literals;
  size_t max_length;
  Command *new_commands;
  size_t newsize;
  int *table;
  size_t table_size;
  size_t storage_ix;
  uint8_t *storage;
  ContextLut literal_context_lut;
  MemoryManager *pMStack_1370;
  ContextType literal_context_mode;
  MemoryManager *m;
  uint8_t *puStack_1360;
  uint32_t mask;
  uint8_t *data;
  uint32_t wrapped_last_processed_pos;
  uint32_t bytes;
  uint64_t delta;
  uint8_t **output_local;
  size_t *out_size_local;
  int force_flush_local;
  int is_last_local;
  BrotliEncoderState *s_local;
  ulong local_1320;
  ulong local_1318;
  BrotliEncoderState *local_1310;
  ulong local_1308;
  uint8_t *local_1300;
  Hasher *local_12f8;
  MemoryManager *local_12f0;
  ulong local_12e8;
  size_t max_backward;
  size_t i;
  size_t i_end;
  size_t i_start;
  uint8_t *local_12c0;
  ulong local_12b8;
  ulong local_12b0;
  anon_union_1048_13_a959428b_for_privat *local_12a8;
  ulong local_12a0;
  ulong local_1298;
  ulong local_1290;
  undefined8 local_1288;
  ulong local_1280;
  Command *local_1278;
  size_t local_1270;
  size_t alloc_size;
  int one_shot;
  ulong local_1258;
  uint8_t *local_1250;
  BrotliEncoderState *local_1248;
  HasherCommon *local_1240;
  MemoryManager *local_1238;
  ulong local_1230;
  uint8_t *local_1228;
  ulong local_1220;
  ulong local_1218;
  anon_union_1048_13_a959428b_for_privat *local_1210;
  ulong local_1208;
  uint8_t *local_1200;
  ulong local_11f8;
  ulong local_11f0;
  anon_union_1048_13_a959428b_for_privat *local_11e8;
  ulong local_11e0;
  uint8_t *local_11d8;
  ulong local_11d0;
  ulong local_11c8;
  anon_union_1048_13_a959428b_for_privat *local_11c0;
  ulong local_11b8;
  uint8_t *local_11b0;
  ulong local_11a8;
  ulong local_11a0;
  anon_union_1048_13_a959428b_for_privat *local_1198;
  ulong local_1190;
  uint8_t *local_1188;
  ulong local_1180;
  ulong local_1178;
  anon_union_1048_13_a959428b_for_privat *local_1170;
  ulong local_1168;
  uint8_t *local_1160;
  ulong local_1158;
  ulong local_1150;
  anon_union_1048_13_a959428b_for_privat *local_1148;
  ulong local_1140;
  uint8_t *local_1138;
  ulong local_1130;
  ulong local_1128;
  anon_union_1048_13_a959428b_for_privat *local_1120;
  ulong local_1118;
  uint8_t *local_1110;
  ulong local_1108;
  ulong local_1100;
  anon_union_1048_13_a959428b_for_privat *local_10f8;
  ulong local_10f0;
  uint8_t *local_10e8;
  ulong local_10e0;
  ulong local_10d8;
  anon_union_1048_13_a959428b_for_privat *local_10d0;
  ulong local_10c8;
  uint8_t *local_10c0;
  ulong local_10b8;
  ulong local_10b0;
  anon_union_1048_13_a959428b_for_privat *local_10a8;
  ulong local_10a0;
  uint8_t *local_1098;
  ulong local_1090;
  ulong local_1088;
  anon_union_1048_13_a959428b_for_privat *local_1080;
  ulong local_1078;
  uint8_t *local_1070;
  ulong local_1068;
  ulong local_1060;
  anon_union_1048_13_a959428b_for_privat *local_1058;
  ulong local_1050;
  uint8_t *local_1048;
  ulong local_1040;
  ulong local_1038;
  anon_union_1048_13_a959428b_for_privat *local_1030;
  ulong local_1028;
  uint8_t *local_1020;
  ulong local_1018;
  ulong local_1010;
  anon_union_1048_13_a959428b_for_privat *local_1008;
  ulong local_1000;
  uint8_t *local_ff8;
  ulong local_ff0;
  ulong local_fe8;
  anon_union_1048_13_a959428b_for_privat *local_fe0;
  BrotliHasherParams *local_fd8;
  BrotliEncoderState *local_fd0;
  ulong local_fc8;
  uint local_fbc;
  BrotliEncoderState *local_fb8;
  size_t local_fb0;
  HasherCommon *local_fa8;
  ulong local_f90;
  uint local_f84;
  BrotliEncoderState *local_f80;
  ulong local_f78;
  uint local_f6c;
  BrotliEncoderState *local_f68;
  ulong local_f60;
  uint local_f54;
  BrotliEncoderState *local_f50;
  long local_f48;
  size_t block_size;
  size_t bucket_size;
  uint local_f2c;
  BrotliEncoderState *local_f28;
  long local_f20;
  size_t block_size_1;
  size_t bucket_size_1;
  uint local_f04;
  BrotliEncoderState *local_f00;
  ulong local_ef8;
  uint local_eec;
  BrotliEncoderState *local_ee8;
  ulong local_ee0;
  uint local_ed4;
  BrotliEncoderState *local_ed0;
  ulong local_ec8;
  uint local_ebc;
  BrotliEncoderState *local_eb8;
  ulong local_eb0;
  uint local_ea4;
  BrotliEncoderState *local_ea0;
  ulong local_e98;
  uint local_e8c;
  BrotliEncoderState *local_e88;
  ulong local_e80;
  uint local_e74;
  BrotliEncoderState *local_e70;
  ulong local_e68;
  uint local_e5c;
  BrotliEncoderState *local_e58;
  ulong local_e50;
  uint local_e44;
  BrotliEncoderState *local_e40;
  ulong local_e38;
  uint local_e2c;
  BrotliEncoderState *local_e28;
  long local_e20;
  size_t block_size_2;
  size_t bucket_size_2;
  uint local_e04;
  BrotliEncoderState *local_e00;
  ulong local_df8;
  size_t num_nodes;
  uint local_de4;
  BrotliEncoderState *local_de0;
  ulong local_dd8;
  uint local_dcc;
  BrotliEncoderState *local_dc8;
  ulong local_dc0;
  uint local_db4;
  BrotliEncoderState *local_db0;
  ulong local_da8;
  uint local_d9c;
  BrotliEncoderState *local_d98;
  uint32_t local_d8c;
  ulong uStack_d88;
  uint32_t key_2;
  ulong local_d80;
  uint8_t *local_d78;
  anon_union_1048_13_a959428b_for_privat *local_d70;
  uint32_t local_d64;
  ulong uStack_d60;
  uint32_t key_1;
  ulong local_d58;
  uint8_t *local_d50;
  anon_union_1048_13_a959428b_for_privat *local_d48;
  uint32_t local_d3c;
  ulong uStack_d38;
  uint32_t key;
  ulong local_d30;
  uint8_t *local_d28;
  anon_union_1048_13_a959428b_for_privat *local_d20;
  uint local_d18;
  uint32_t local_d14;
  uint32_t off_11;
  uint32_t key_29;
  ulong local_d08;
  uint8_t *local_d00;
  anon_union_1048_13_a959428b_for_privat *local_cf8;
  uint local_cf0;
  uint32_t local_cec;
  uint32_t off_10;
  uint32_t key_28;
  ulong local_ce0;
  uint8_t *local_cd8;
  anon_union_1048_13_a959428b_for_privat *local_cd0;
  uint local_cc8;
  uint32_t local_cc4;
  uint32_t off_9;
  uint32_t key_27;
  ulong local_cb8;
  uint8_t *local_cb0;
  anon_union_1048_13_a959428b_for_privat *local_ca8;
  uint local_ca0;
  uint32_t local_c9c;
  uint32_t off_2;
  uint32_t key_5;
  ulong local_c90;
  uint8_t *local_c88;
  anon_union_1048_13_a959428b_for_privat *local_c80;
  uint local_c78;
  uint32_t local_c74;
  uint32_t off_1;
  uint32_t key_4;
  ulong local_c68;
  uint8_t *local_c60;
  anon_union_1048_13_a959428b_for_privat *local_c58;
  uint local_c50;
  uint32_t local_c4c;
  uint32_t off;
  uint32_t key_3;
  ulong local_c40;
  uint8_t *local_c38;
  anon_union_1048_13_a959428b_for_privat *local_c30;
  uint local_c28;
  uint32_t local_c24;
  uint32_t off_5;
  uint32_t key_8;
  ulong local_c18;
  uint8_t *local_c10;
  anon_union_1048_13_a959428b_for_privat *local_c08;
  uint local_c00;
  uint32_t local_bfc;
  uint32_t off_4;
  uint32_t key_7;
  ulong local_bf0;
  uint8_t *local_be8;
  anon_union_1048_13_a959428b_for_privat *local_be0;
  uint local_bd8;
  uint32_t local_bd4;
  uint32_t off_3;
  uint32_t key_6;
  ulong local_bc8;
  uint8_t *local_bc0;
  anon_union_1048_13_a959428b_for_privat *local_bb8;
  long local_bb0;
  size_t offset_2;
  size_t minor_ix_2;
  ulong uStack_b98;
  uint32_t key_11;
  ulong local_b90;
  uint8_t *local_b88;
  anon_union_1048_13_a959428b_for_privat *local_b80;
  long local_b78;
  size_t offset_1;
  size_t minor_ix_1;
  ulong uStack_b60;
  uint32_t key_10;
  ulong local_b58;
  uint8_t *local_b50;
  anon_union_1048_13_a959428b_for_privat *local_b48;
  long local_b40;
  size_t offset;
  size_t minor_ix;
  ulong uStack_b28;
  uint32_t key_9;
  ulong local_b20;
  uint8_t *local_b18;
  anon_union_1048_13_a959428b_for_privat *local_b10;
  long local_b08;
  size_t offset_8;
  size_t minor_ix_8;
  uint32_t *puStack_af0;
  uint32_t key_35;
  uint32_t *buckets_5;
  uint16_t *num_5;
  ulong local_ad8;
  uint8_t *local_ad0;
  anon_union_1048_13_a959428b_for_privat *local_ac8;
  ulong local_ac0;
  uint64_t h_14;
  ulong local_ab0;
  ulong *local_aa8;
  ulong *local_aa0;
  long local_a98;
  size_t offset_7;
  size_t minor_ix_7;
  uint32_t *puStack_a80;
  uint32_t key_34;
  uint32_t *buckets_4;
  uint16_t *num_4;
  ulong local_a68;
  uint8_t *local_a60;
  anon_union_1048_13_a959428b_for_privat *local_a58;
  ulong local_a50;
  uint64_t h_13;
  ulong local_a40;
  ulong *local_a38;
  ulong *local_a30;
  long local_a28;
  size_t offset_6;
  size_t minor_ix_6;
  uint32_t *puStack_a10;
  uint32_t key_33;
  uint32_t *buckets_3;
  uint16_t *num_3;
  ulong local_9f8;
  uint8_t *local_9f0;
  anon_union_1048_13_a959428b_for_privat *local_9e8;
  ulong local_9e0;
  uint64_t h_12;
  ulong local_9d0;
  ulong *local_9c8;
  ulong *local_9c0;
  long local_9b8;
  size_t offset_5;
  size_t minor_ix_5;
  uint32_t *puStack_9a0;
  uint32_t key_14;
  uint32_t *buckets_2;
  uint16_t *num_2;
  ulong local_988;
  uint8_t *local_980;
  anon_union_1048_13_a959428b_for_privat *local_978;
  ulong local_970;
  uint64_t h_2;
  ulong local_960;
  ulong *local_958;
  ulong *local_950;
  long local_948;
  size_t offset_4;
  size_t minor_ix_4;
  uint32_t *puStack_930;
  uint32_t key_13;
  uint32_t *buckets_1;
  uint16_t *num_1;
  ulong local_918;
  uint8_t *local_910;
  anon_union_1048_13_a959428b_for_privat *local_908;
  ulong local_900;
  uint64_t h_1;
  ulong local_8f0;
  ulong *local_8e8;
  ulong *local_8e0;
  long local_8d8;
  size_t offset_3;
  size_t minor_ix_3;
  uint32_t *puStack_8c0;
  uint32_t key_12;
  uint32_t *buckets;
  uint16_t *num;
  ulong local_8a8;
  uint8_t *local_8a0;
  anon_union_1048_13_a959428b_for_privat *local_898;
  ulong local_890;
  uint64_t h;
  ulong local_880;
  ulong *local_878;
  ulong *local_870;
  ulong local_868;
  size_t delta_3;
  size_t idx_2;
  size_t bank_2;
  size_t key_17;
  BankH40 *banks_2;
  uint8_t *tiny_hash_2;
  uint16_t *head_2;
  uint32_t *addr_2;
  ulong local_820;
  uint8_t *local_818;
  anon_union_1048_13_a959428b_for_privat *local_810;
  uint local_804;
  int *piStack_800;
  uint32_t h_5;
  int *local_7f8;
  ulong local_7f0;
  size_t delta_2;
  size_t idx_1;
  size_t bank_1;
  size_t key_16;
  BankH40 *banks_1;
  uint8_t *tiny_hash_1;
  uint16_t *head_1;
  uint32_t *addr_1;
  ulong local_7a8;
  uint8_t *local_7a0;
  anon_union_1048_13_a959428b_for_privat *local_798;
  uint local_78c;
  int *piStack_788;
  uint32_t h_4;
  int *local_780;
  ulong local_778;
  size_t delta_1;
  size_t idx;
  size_t bank;
  size_t key_15;
  BankH40 *banks;
  uint8_t *tiny_hash;
  uint16_t *head;
  uint32_t *addr;
  ulong local_730;
  uint8_t *local_728;
  anon_union_1048_13_a959428b_for_privat *local_720;
  uint local_714;
  int *piStack_710;
  uint32_t h_3;
  int *local_708;
  ulong local_700;
  size_t delta_6;
  size_t idx_5;
  size_t bank_5;
  size_t key_20;
  BankH41 *banks_5;
  uint8_t *tiny_hash_5;
  uint16_t *head_5;
  uint32_t *addr_5;
  ulong local_6b8;
  uint8_t *local_6b0;
  anon_union_1048_13_a959428b_for_privat *local_6a8;
  uint local_69c;
  int *piStack_698;
  uint32_t h_8;
  int *local_690;
  ulong local_688;
  size_t delta_5;
  size_t idx_4;
  size_t bank_4;
  size_t key_19;
  BankH41 *banks_4;
  uint8_t *tiny_hash_4;
  uint16_t *head_4;
  uint32_t *addr_4;
  ulong local_640;
  uint8_t *local_638;
  anon_union_1048_13_a959428b_for_privat *local_630;
  uint local_624;
  int *piStack_620;
  uint32_t h_7;
  int *local_618;
  ulong local_610;
  size_t delta_4;
  size_t idx_3;
  size_t bank_3;
  size_t key_18;
  BankH41 *banks_3;
  uint8_t *tiny_hash_3;
  uint16_t *head_3;
  uint32_t *addr_3;
  ulong local_5c8;
  uint8_t *local_5c0;
  anon_union_1048_13_a959428b_for_privat *local_5b8;
  uint local_5ac;
  int *piStack_5a8;
  uint32_t h_6;
  int *local_5a0;
  ulong local_598;
  size_t delta_9;
  size_t idx_8;
  size_t bank_8;
  size_t key_23;
  BankH42 *banks_8;
  uint8_t *tiny_hash_8;
  uint16_t *head_8;
  uint32_t *addr_8;
  ulong local_550;
  uint8_t *local_548;
  anon_union_1048_13_a959428b_for_privat *local_540;
  uint local_534;
  int *piStack_530;
  uint32_t h_11;
  int *local_528;
  ulong local_520;
  size_t delta_8;
  size_t idx_7;
  size_t bank_7;
  size_t key_22;
  BankH42 *banks_7;
  uint8_t *tiny_hash_7;
  uint16_t *head_7;
  uint32_t *addr_7;
  ulong local_4d8;
  uint8_t *local_4d0;
  anon_union_1048_13_a959428b_for_privat *local_4c8;
  uint local_4bc;
  int *piStack_4b8;
  uint32_t h_10;
  int *local_4b0;
  ulong local_4a8;
  size_t delta_7;
  size_t idx_6;
  size_t bank_6;
  size_t key_21;
  BankH42 *banks_6;
  uint8_t *tiny_hash_6;
  uint16_t *head_6;
  uint32_t *addr_6;
  ulong local_460;
  uint8_t *local_458;
  anon_union_1048_13_a959428b_for_privat *local_450;
  uint local_444;
  int *piStack_440;
  uint32_t h_9;
  int *local_438;
  uint local_430;
  uint32_t local_42c;
  uint32_t off_14;
  uint32_t key_32;
  ulong local_420;
  uint8_t *local_418;
  anon_union_1048_13_a959428b_for_privat *local_410;
  uint local_408;
  uint32_t local_404;
  uint32_t off_13;
  uint32_t key_31;
  ulong local_3f8;
  uint8_t *local_3f0;
  anon_union_1048_13_a959428b_for_privat *local_3e8;
  uint local_3e0;
  uint32_t local_3dc;
  uint32_t off_12;
  uint32_t key_30;
  ulong local_3d0;
  uint8_t *local_3c8;
  anon_union_1048_13_a959428b_for_privat *local_3c0;
  uint local_3b8;
  uint32_t local_3b4;
  uint32_t off_8;
  uint32_t key_26;
  ulong local_3a8;
  uint8_t *local_3a0;
  anon_union_1048_13_a959428b_for_privat *local_398;
  uint local_390;
  uint32_t local_38c;
  uint32_t off_7;
  uint32_t key_25;
  ulong local_380;
  uint8_t *local_378;
  anon_union_1048_13_a959428b_for_privat *local_370;
  uint local_368;
  uint32_t local_364;
  uint32_t off_6;
  uint32_t key_24;
  ulong local_358;
  uint8_t *local_350;
  anon_union_1048_13_a959428b_for_privat *local_348;
  ulong local_340;
  size_t diff_1;
  size_t available_1;
  size_t position_masked_1;
  uint8_t *local_320;
  ulong local_318;
  ulong local_310;
  HROLLING_FAST *local_308;
  ulong local_300;
  size_t diff;
  size_t available;
  size_t position_masked;
  uint8_t *local_2e0;
  ulong local_2d8;
  ulong local_2d0;
  HROLLING_FAST *local_2c8;
  ulong local_2c0;
  size_t available_2;
  size_t position_masked_2;
  uint8_t *local_2a8;
  size_t local_2a0;
  ulong local_298;
  HROLLING *local_290;
  ulong local_288;
  size_t len;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix;
  uint32_t *forest;
  uint32_t *buckets_6;
  uint32_t key_36;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked;
  ulong *local_208;
  ulong local_200;
  long local_1f8;
  size_t local_1f0;
  size_t local_1e8;
  uint8_t *local_1e0;
  anon_union_1048_13_a959428b_for_privat *local_1d8;
  size_t local_1d0;
  size_t local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  size_t local_1b0;
  anon_union_1048_13_a959428b_for_privat *local_1a8;
  size_t local_1a0;
  anon_union_1048_13_a959428b_for_privat *local_198;
  ulong local_190;
  anon_union_1048_13_a959428b_for_privat *local_188;
  size_t local_180;
  anon_union_1048_13_a959428b_for_privat *local_178;
  size_t local_170;
  anon_union_1048_13_a959428b_for_privat *local_168;
  ulong local_160;
  anon_union_1048_13_a959428b_for_privat *local_158;
  ulong local_150;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_128;
  uint8_t *local_120;
  size_t local_118;
  ulong *local_110;
  ulong *local_108;
  ulong *local_100;
  ulong *local_f8;
  ulong local_f0;
  ulong local_e8;
  size_t local_e0;
  undefined2 local_d4;
  ushort local_d2;
  uint16_t copycode;
  uint16_t *puStack_d0;
  uint16_t inscode;
  undefined4 local_c4;
  undefined8 local_c0;
  ulong local_b8;
  int local_ac;
  ulong uStack_a8;
  uint32_t nbits;
  ushort local_9e;
  undefined8 uStack_98;
  uint32_t nbits_1;
  undefined2 local_8e;
  int local_8c;
  ushort local_86;
  uint32_t offset_9;
  uint16_t bits64;
  ushort local_7c;
  ushort local_7a;
  long local_68;
  long local_60;
  int local_54;
  BrotliEncoderState *pBStack_50;
  int bits;
  undefined4 local_48;
  int local_44;
  BrotliEncoderState *local_40;
  int local_38;
  int local_34;
  
  delta = (uint64_t)output;
  output_local = (uint8_t **)out_size;
  out_size_local._0_4_ = force_flush;
  out_size_local._4_4_ = is_last;
  _force_flush_local = s;
  _wrapped_last_processed_pos = UnprocessedInputSize(s);
  data._4_4_ = (uint)_wrapped_last_processed_pos;
  data._0_4_ = WrapPosition(_force_flush_local->last_processed_pos_);
  uVar10 = _wrapped_last_processed_pos;
  pMStack_1370 = &_force_flush_local->memory_manager_;
  puStack_1360 = (_force_flush_local->ringbuffer_).buffer_;
  m._4_4_ = (_force_flush_local->ringbuffer_).mask_;
  if (_force_flush_local->is_last_block_emitted_ == 0) {
    if (out_size_local._4_4_ != 0) {
      _force_flush_local->is_last_block_emitted_ = 1;
    }
    sVar7 = InputBlockSize(_force_flush_local);
    if (sVar7 < uVar10) {
      s_local._0_4_ = 0;
    }
    else {
      if (((_force_flush_local->params).quality == 1) &&
         (_force_flush_local->command_buf_ == (uint32_t *)0x0)) {
        puVar8 = (uint32_t *)BrotliAllocate(pMStack_1370,0x80000);
        _force_flush_local->command_buf_ = puVar8;
        puVar9 = (uint8_t *)BrotliAllocate(pMStack_1370,0x20000);
        _force_flush_local->literal_buf_ = puVar9;
      }
      if (((_force_flush_local->params).quality == 0) || ((_force_flush_local->params).quality == 1)
         ) {
        table_size = (size_t)_force_flush_local->last_bytes_bits_;
        if ((_wrapped_last_processed_pos == 0) && (out_size_local._4_4_ == 0)) {
          *output_local = (uint8_t *)0x0;
          s_local._0_4_ = 1;
        }
        else {
          storage_ix = (size_t)GetBrotliStorage(_force_flush_local,(ulong)(data._4_4_ * 2 + 0x1f7));
          *(uint8_t *)storage_ix = (uint8_t)_force_flush_local->last_bytes_;
          *(uint8_t *)(storage_ix + 1) = (uint8_t)(_force_flush_local->last_bytes_ >> 8);
          newsize = (size_t)GetHashTable(_force_flush_local,(_force_flush_local->params).quality,
                                         (ulong)data._4_4_,(size_t *)&table);
          if ((_force_flush_local->params).quality == 0) {
            BrotliCompressFragmentFast
                      (pMStack_1370,puStack_1360 + ((uint32_t)data & m._4_4_),(ulong)data._4_4_,
                       out_size_local._4_4_,(int *)newsize,(size_t)table,
                       _force_flush_local->cmd_depths_,_force_flush_local->cmd_bits_,
                       &_force_flush_local->cmd_code_numbits_,_force_flush_local->cmd_code_,
                       &table_size,(uint8_t *)storage_ix);
          }
          else {
            BrotliCompressFragmentTwoPass
                      (pMStack_1370,puStack_1360 + ((uint32_t)data & m._4_4_),(ulong)data._4_4_,
                       out_size_local._4_4_,_force_flush_local->command_buf_,
                       _force_flush_local->literal_buf_,(int *)newsize,(size_t)table,&table_size,
                       (uint8_t *)storage_ix);
          }
          _force_flush_local->last_bytes_ = (ushort)*(byte *)(storage_ix + (table_size >> 3));
          _force_flush_local->last_bytes_bits_ = (byte)table_size & 7;
          UpdateLastProcessedPos(_force_flush_local);
          *(size_t *)delta = storage_ix;
          *output_local = (uint8_t *)(table_size >> 3);
          s_local._0_4_ = 1;
        }
      }
      else {
        new_commands = (Command *)(_force_flush_local->num_commands_ + (ulong)(data._4_4_ >> 1) + 1)
        ;
        if ((Command *)_force_flush_local->cmd_alloc_size_ < new_commands) {
          new_commands = (Command *)
                         ((long)&new_commands->insert_len_ + (ulong)((data._4_4_ >> 2) + 0x10));
          _force_flush_local->cmd_alloc_size_ = (size_t)new_commands;
          if (new_commands == (Command *)0x0) {
            local_1400 = (void *)0x0;
          }
          else {
            local_1400 = BrotliAllocate(pMStack_1370,(long)new_commands * 0x10);
          }
          max_length = (size_t)local_1400;
          if (_force_flush_local->commands_ != (Command *)0x0) {
            memcpy(local_1400,_force_flush_local->commands_,_force_flush_local->num_commands_ << 4);
            BrotliFree(pMStack_1370,_force_flush_local->commands_);
            _force_flush_local->commands_ = (Command *)0x0;
          }
          _force_flush_local->commands_ = (Command *)max_length;
        }
        local_12f8 = &_force_flush_local->hasher_;
        local_1308 = (ulong)m._4_4_;
        local_1318 = (ulong)(uint32_t)data;
        local_1320 = (ulong)data._4_4_;
        local_12f0 = pMStack_1370;
        local_1300 = puStack_1360;
        local_1310 = _force_flush_local;
        s_local._4_4_ = out_size_local._4_4_;
        local_1238 = pMStack_1370;
        local_1248 = _force_flush_local;
        local_1250 = puStack_1360;
        alloc_size._4_4_ = out_size_local._4_4_;
        local_1401 = local_1318 == 0 && out_size_local._4_4_ != 0;
        alloc_size._0_4_ = (uint)local_1401;
        _one_shot = local_1320;
        local_1258 = local_1318;
        local_1240 = &local_12f8->common;
        if ((local_12f8->common).extra == (void *)0x0) {
          local_fd8 = &(_force_flush_local->params).hasher;
          local_fd0 = _force_flush_local;
          if ((_force_flush_local->params).quality < 10) {
            if (((_force_flush_local->params).quality == 4) &&
               (0xfffff < (_force_flush_local->params).size_hint)) {
              local_fd8->type = 0x36;
            }
            else if ((_force_flush_local->params).quality < 5) {
              local_fd8->type = (_force_flush_local->params).quality;
            }
            else if ((_force_flush_local->params).lgwin < 0x11) {
              if ((_force_flush_local->params).quality < 7) {
                local_1408 = 0x28;
              }
              else {
                local_1408 = 0x2a;
                if ((_force_flush_local->params).quality < 9) {
                  local_1408 = 0x29;
                }
              }
              local_fd8->type = local_1408;
            }
            else if (((_force_flush_local->params).size_hint < 0x100000) ||
                    ((_force_flush_local->params).lgwin < 0x13)) {
              local_fd8->type = 5;
              (_force_flush_local->params).hasher.block_bits =
                   (_force_flush_local->params).quality + -1;
              iVar6 = 0xf;
              if ((_force_flush_local->params).quality < 7) {
                iVar6 = 0xe;
              }
              (_force_flush_local->params).hasher.bucket_bits = iVar6;
              if ((_force_flush_local->params).quality < 7) {
                local_1410 = 4;
              }
              else {
                local_1410 = 0x10;
                if ((_force_flush_local->params).quality < 9) {
                  local_1410 = 10;
                }
              }
              (_force_flush_local->params).hasher.num_last_distances_to_check = local_1410;
            }
            else {
              local_fd8->type = 6;
              (_force_flush_local->params).hasher.block_bits =
                   (_force_flush_local->params).quality + -1;
              (_force_flush_local->params).hasher.bucket_bits = 0xf;
              (_force_flush_local->params).hasher.hash_len = 5;
              if ((_force_flush_local->params).quality < 7) {
                local_140c = 4;
              }
              else {
                local_140c = 0x10;
                if ((_force_flush_local->params).quality < 9) {
                  local_140c = 10;
                }
              }
              (_force_flush_local->params).hasher.num_last_distances_to_check = local_140c;
            }
          }
          else {
            local_fd8->type = 10;
          }
          if (0x18 < (_force_flush_local->params).lgwin) {
            if (local_fd8->type == 3) {
              local_fd8->type = 0x23;
            }
            if (local_fd8->type == 0x36) {
              local_fd8->type = 0x37;
            }
            if (local_fd8->type == 6) {
              local_fd8->type = 0x41;
            }
          }
          local_fb8 = _force_flush_local;
          switch((_force_flush_local->params).hasher.type) {
          case 2:
            local_f80 = _force_flush_local;
            local_fb0 = 0x40000;
            local_f90 = local_1320;
            local_f84 = (uint)alloc_size;
            break;
          case 3:
            local_f68 = _force_flush_local;
            local_fb0 = 0x40000;
            local_f78 = local_1320;
            local_f6c = (uint)alloc_size;
            break;
          case 4:
            local_f50 = _force_flush_local;
            local_fb0 = 0x80000;
            local_f60 = local_1320;
            local_f54 = (uint)alloc_size;
            break;
          case 5:
            local_f28 = _force_flush_local;
            block_size = 1L << ((byte)(_force_flush_local->params).hasher.bucket_bits & 0x3f);
            local_f48 = 1L << ((byte)(_force_flush_local->params).hasher.block_bits & 0x3f);
            local_fb0 = block_size * 2 + block_size * 4 * local_f48;
            bucket_size = local_1320;
            local_f2c = (uint)alloc_size;
            break;
          case 6:
            local_f00 = _force_flush_local;
            block_size_1 = 1L << ((byte)(_force_flush_local->params).hasher.bucket_bits & 0x3f);
            local_f20 = 1L << ((byte)(_force_flush_local->params).hasher.block_bits & 0x3f);
            local_fb0 = block_size_1 * 2 + block_size_1 * 4 * local_f20;
            bucket_size_1 = local_1320;
            local_f04 = (uint)alloc_size;
            break;
          default:
            local_fb0 = 0;
            break;
          case 10:
            local_de0 = _force_flush_local;
            local_df8 = 1L << ((byte)(_force_flush_local->params).lgwin & 0x3f);
            if (((uint)alloc_size != 0) && (local_1320 < local_df8)) {
              local_df8 = local_1320;
            }
            local_fb0 = local_df8 * 8 + 0x80000;
            num_nodes = local_1320;
            local_de4 = (uint)alloc_size;
            break;
          case 0x23:
            local_e88 = _force_flush_local;
            local_e70 = _force_flush_local;
            local_db0 = _force_flush_local;
            local_fb0 = 0x4040000;
            local_e98 = local_1320;
            local_e8c = (uint)alloc_size;
            local_e80 = local_1320;
            local_e74 = (uint)alloc_size;
            local_dc0 = local_1320;
            local_db4 = (uint)alloc_size;
            break;
          case 0x28:
            local_ee8 = _force_flush_local;
            local_fb0 = 0x80000;
            local_ef8 = local_1320;
            local_eec = (uint)alloc_size;
            break;
          case 0x29:
            local_ed0 = _force_flush_local;
            local_fb0 = 0x80000;
            local_ee0 = local_1320;
            local_ed4 = (uint)alloc_size;
            break;
          case 0x2a:
            local_eb8 = _force_flush_local;
            local_fb0 = 0x140000;
            local_ec8 = local_1320;
            local_ebc = (uint)alloc_size;
            break;
          case 0x36:
            local_ea0 = _force_flush_local;
            local_fb0 = 0x400000;
            local_eb0 = local_1320;
            local_ea4 = (uint)alloc_size;
            break;
          case 0x37:
            local_e58 = _force_flush_local;
            local_e40 = _force_flush_local;
            local_dc8 = _force_flush_local;
            local_fb0 = 0x4400000;
            local_e68 = local_1320;
            local_e5c = (uint)alloc_size;
            local_e50 = local_1320;
            local_e44 = (uint)alloc_size;
            local_dd8 = local_1320;
            local_dcc = (uint)alloc_size;
            break;
          case 0x41:
            local_e28 = _force_flush_local;
            local_e00 = _force_flush_local;
            block_size_2 = 1L << ((byte)(_force_flush_local->params).hasher.bucket_bits & 0x3f);
            local_e20 = 1L << ((byte)(_force_flush_local->params).hasher.block_bits & 0x3f);
            local_d98 = _force_flush_local;
            local_fb0 = block_size_2 * 2 + block_size_2 * 4 * local_e20 + 0x4000000;
            local_e38 = local_1320;
            local_e2c = (uint)alloc_size;
            bucket_size_2 = local_1320;
            local_e04 = (uint)alloc_size;
            local_da8 = local_1320;
            local_d9c = (uint)alloc_size;
          }
          local_1270 = local_fb0;
          local_fc8 = local_1320;
          local_fbc = (uint)alloc_size;
          if (local_fb0 == 0) {
            local_1420 = (void *)0x0;
          }
          else {
            local_1420 = BrotliAllocate(pMStack_1370,local_fb0);
          }
          local_1240->extra = local_1420;
          (local_1240->params).num_last_distances_to_check =
               (local_1248->params).hasher.num_last_distances_to_check;
          iVar6 = (local_1248->params).hasher.bucket_bits;
          iVar2 = (local_1248->params).hasher.block_bits;
          iVar3 = (local_1248->params).hasher.hash_len;
          (local_1240->params).type = (local_1248->params).hasher.type;
          (local_1240->params).bucket_bits = iVar6;
          (local_1240->params).block_bits = iVar2;
          (local_1240->params).hash_len = iVar3;
          switch((local_1240->params).type) {
          case 2:
            InitializeH2(local_1240,(H2 *)(local_1240 + 1),&local_1248->params);
            break;
          case 3:
            InitializeH3(local_1240,(H3 *)(local_1240 + 1),&local_1248->params);
            break;
          case 4:
            InitializeH4(local_1240,(H4 *)(local_1240 + 1),&local_1248->params);
            break;
          case 5:
            InitializeH5(local_1240,(H5 *)(local_1240 + 1),&local_1248->params);
            break;
          case 6:
            InitializeH6(local_1240,(H6 *)(local_1240 + 1),&local_1248->params);
            break;
          default:
            break;
          case 10:
            InitializeH10(local_1240,(H10 *)(local_1240 + 1),&local_1248->params);
            break;
          case 0x23:
            InitializeH35(local_1240,(H35 *)(local_1240 + 1),&local_1248->params);
            break;
          case 0x28:
            InitializeH40(local_1240,(H40 *)(local_1240 + 1),&local_1248->params);
            break;
          case 0x29:
            InitializeH41(local_1240,(H41 *)(local_1240 + 1),&local_1248->params);
            break;
          case 0x2a:
            InitializeH42(local_1240,(H42 *)(local_1240 + 1),&local_1248->params);
            break;
          case 0x36:
            InitializeH54(local_1240,(H54 *)(local_1240 + 1),&local_1248->params);
            break;
          case 0x37:
            InitializeH55(local_1240,(H55 *)(local_1240 + 1),&local_1248->params);
            break;
          case 0x41:
            InitializeH65(local_1240,(H65 *)(local_1240 + 1),&local_1248->params);
          }
          local_fa8 = local_1240;
          local_1240->is_prepared_ = 0;
        }
        if (local_1240->is_prepared_ == 0) {
          switch((local_1240->params).type) {
          case 2:
            PrepareH2((H2 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 3:
            PrepareH3((H3 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 4:
            PrepareH4((H4 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 5:
            PrepareH5((H5 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 6:
            PrepareH6((H6 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          default:
            break;
          case 10:
            PrepareH10((H10 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 0x23:
            PrepareH35((H35 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 0x28:
            PrepareH40((H40 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 0x29:
            PrepareH41((H41 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 0x2a:
            PrepareH42((H42 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 0x36:
            PrepareH54((H54 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 0x37:
            PrepareH55((H55 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
            break;
          case 0x41:
            PrepareH65((H65 *)(local_1240 + 1),(uint)alloc_size,_one_shot,local_1250);
          }
          if (local_1258 == 0) {
            local_1240->dict_num_lookups = 0;
            local_1240->dict_num_matches = 0;
          }
          local_1240->is_prepared_ = 1;
        }
        switch((local_12f8->common).params.type) {
        case 2:
          local_1210 = &local_12f8->privat;
          local_1218 = local_1320;
          local_1220 = local_1318;
          local_1228 = local_1300;
          local_1230 = local_1308;
          if ((6 < local_1320) && (2 < local_1318)) {
            uStack_d38 = local_1318 - 3;
            local_d28 = local_1300;
            local_d30 = local_1308;
            local_d20 = local_1210;
            local_d3c = HashBytesH2(local_1300 + (uStack_d38 & local_1308));
            (local_d20->_H2).buckets_[local_d3c] = (uint32_t)uStack_d38;
            uStack_d60 = local_1220 - 2;
            local_d48 = local_1210;
            local_d50 = local_1228;
            local_d58 = local_1230;
            local_d64 = HashBytesH2(local_1228 + (uStack_d60 & local_1230));
            (local_d48->_H2).buckets_[local_d64] = (uint32_t)uStack_d60;
            uStack_d88 = local_1220 - 1;
            local_d70 = local_1210;
            local_d78 = local_1228;
            local_d80 = local_1230;
            local_d8c = HashBytesH2(local_1228 + (uStack_d88 & local_1230));
            (local_d70->_H2).buckets_[local_d8c] = (uint32_t)uStack_d88;
          }
          break;
        case 3:
          local_11e8 = &local_12f8->privat;
          local_11f0 = local_1320;
          local_11f8 = local_1318;
          local_1200 = local_1300;
          local_1208 = local_1308;
          if ((6 < local_1320) && (2 < local_1318)) {
            _off = local_1318 - 3;
            local_c38 = local_1300;
            local_c40 = local_1308;
            local_c30 = local_11e8;
            local_c4c = HashBytesH3(local_1300 + (_off & local_1308));
            local_c50 = (uint)_off & 8;
            (local_c30->_H2).buckets_[local_c4c + local_c50 & 0xffff] = (uint)_off;
            _off_1 = local_11f8 - 2;
            local_c58 = local_11e8;
            local_c60 = local_1200;
            local_c68 = local_1208;
            local_c74 = HashBytesH3(local_1200 + (_off_1 & local_1208));
            local_c78 = (uint)_off_1 & 8;
            (local_c58->_H2).buckets_[local_c74 + local_c78 & 0xffff] = (uint)_off_1;
            _off_2 = local_11f8 - 1;
            local_c80 = local_11e8;
            local_c88 = local_1200;
            local_c90 = local_1208;
            local_c9c = HashBytesH3(local_1200 + (_off_2 & local_1208));
            local_ca0 = (uint)_off_2 & 8;
            (local_c80->_H2).buckets_[local_c9c + local_ca0 & 0xffff] = (uint)_off_2;
          }
          break;
        case 4:
          local_11c0 = &local_12f8->privat;
          local_11c8 = local_1320;
          local_11d0 = local_1318;
          local_11d8 = local_1300;
          local_11e0 = local_1308;
          if ((6 < local_1320) && (2 < local_1318)) {
            _off_3 = local_1318 - 3;
            local_bc0 = local_1300;
            local_bc8 = local_1308;
            local_bb8 = local_11c0;
            local_bd4 = HashBytesH4(local_1300 + (_off_3 & local_1308));
            local_bd8 = (uint)_off_3 & 0x18;
            (local_bb8->_H2).buckets_[local_bd4 + local_bd8 & 0x1ffff] = (uint)_off_3;
            _off_4 = local_11d0 - 2;
            local_be0 = local_11c0;
            local_be8 = local_11d8;
            local_bf0 = local_11e0;
            local_bfc = HashBytesH4(local_11d8 + (_off_4 & local_11e0));
            local_c00 = (uint)_off_4 & 0x18;
            (local_be0->_H2).buckets_[local_bfc + local_c00 & 0x1ffff] = (uint)_off_4;
            _off_5 = local_11d0 - 1;
            local_c08 = local_11c0;
            local_c10 = local_11d8;
            local_c18 = local_11e0;
            local_c24 = HashBytesH4(local_11d8 + (_off_5 & local_11e0));
            local_c28 = (uint)_off_5 & 0x18;
            (local_c08->_H2).buckets_[local_c24 + local_c28 & 0x1ffff] = (uint)_off_5;
          }
          break;
        case 5:
          local_1198 = &local_12f8->privat;
          local_11a0 = local_1320;
          local_11a8 = local_1318;
          local_11b0 = local_1300;
          local_11b8 = local_1308;
          if ((2 < local_1320) && (2 < local_1318)) {
            uStack_b28 = local_1318 - 3;
            local_b18 = local_1300;
            local_b20 = local_1308;
            local_b10 = local_1198;
            minor_ix._4_4_ =
                 HashBytesH5(local_1300 + (uStack_b28 & local_1308),
                             (local_12f8->privat)._H5.hash_shift_);
            offset = (size_t)((uint)*(ushort *)
                                     (*(long *)&(local_b10->_H35).hb.chunk_len +
                                     (ulong)minor_ix._4_4_ * 2) &
                             *(uint *)&(local_b10->_H65).ha.field_0x14);
            local_b40 = offset + (minor_ix._4_4_ <<
                                 ((byte)*(undefined4 *)&(local_b10->_H35).hb.table & 0x1f));
            *(int *)(*(long *)((long)local_b10 + 0x30) + local_b40 * 4) = (int)uStack_b28;
            lVar11 = *(long *)&(local_b10->_H35).hb.chunk_len;
            *(short *)(lVar11 + (ulong)minor_ix._4_4_ * 2) =
                 *(short *)(lVar11 + (ulong)minor_ix._4_4_ * 2) + 1;
            uStack_b60 = local_11a8 - 2;
            local_b48 = local_1198;
            local_b50 = local_11b0;
            local_b58 = local_11b8;
            minor_ix_1._4_4_ =
                 HashBytesH5(local_11b0 + (uStack_b60 & local_11b8),(local_1198->_H5).hash_shift_);
            offset_1 = (size_t)((uint)*(ushort *)
                                       (*(long *)&(local_b48->_H35).hb.chunk_len +
                                       (ulong)minor_ix_1._4_4_ * 2) &
                               *(uint *)&(local_b48->_H65).ha.field_0x14);
            local_b78 = offset_1 +
                        (minor_ix_1._4_4_ <<
                        ((byte)*(undefined4 *)&(local_b48->_H35).hb.table & 0x1f));
            *(int *)(*(long *)((long)local_b48 + 0x30) + local_b78 * 4) = (int)uStack_b60;
            lVar11 = *(long *)&(local_b48->_H35).hb.chunk_len;
            *(short *)(lVar11 + (ulong)minor_ix_1._4_4_ * 2) =
                 *(short *)(lVar11 + (ulong)minor_ix_1._4_4_ * 2) + 1;
            uStack_b98 = local_11a8 - 1;
            local_b80 = local_1198;
            local_b88 = local_11b0;
            local_b90 = local_11b8;
            minor_ix_2._4_4_ =
                 HashBytesH5(local_11b0 + (uStack_b98 & local_11b8),(local_1198->_H5).hash_shift_);
            offset_2 = (size_t)((uint)*(ushort *)
                                       (*(long *)&(local_b80->_H35).hb.chunk_len +
                                       (ulong)minor_ix_2._4_4_ * 2) &
                               *(uint *)&(local_b80->_H65).ha.field_0x14);
            local_bb0 = offset_2 +
                        (minor_ix_2._4_4_ <<
                        ((byte)*(undefined4 *)&(local_b80->_H35).hb.table & 0x1f));
            *(int *)(*(long *)((long)local_b80 + 0x30) + local_bb0 * 4) = (int)uStack_b98;
            lVar11 = *(long *)&(local_b80->_H35).hb.chunk_len;
            *(short *)(lVar11 + (ulong)minor_ix_2._4_4_ * 2) =
                 *(short *)(lVar11 + (ulong)minor_ix_2._4_4_ * 2) + 1;
          }
          break;
        case 6:
          local_1170 = &local_12f8->privat;
          local_1178 = local_1320;
          local_1180 = local_1318;
          local_1188 = local_1300;
          local_1190 = local_1308;
          if ((6 < local_1320) && (2 < local_1318)) {
            num = (uint16_t *)(local_1318 - 3);
            local_8a0 = local_1300;
            local_8a8 = local_1308;
            buckets = (uint32_t *)(local_12f8->privat)._H6.num_;
            puStack_8c0 = (local_12f8->privat)._H6.buckets_;
            local_878 = (ulong *)(local_1300 + ((ulong)num & local_1308));
            local_880 = (local_12f8->privat)._H6.hash_mask_;
            h._4_4_ = (local_12f8->privat)._H35.hb.state;
            local_890 = (*local_878 & local_880) * 0x1fe35a7bd3579bd3;
            uVar10 = local_890 >> ((byte)h._4_4_ & 0x3f);
            minor_ix_3._4_4_ = (int)uVar10;
            offset_3 = (size_t)((uint)*(ushort *)((long)buckets + (uVar10 & 0xffffffff) * 2) &
                               (local_12f8->privat)._H6.block_mask_);
            local_8d8 = offset_3 +
                        (uint)(minor_ix_3._4_4_ <<
                              ((byte)*(undefined4 *)
                                      ((long)&(local_12f8->privat)._H35.hb.next_ix + 4) & 0x1f));
            *(uint16_t *)((long)buckets + (uVar10 & 0xffffffff) * 2) =
                 *(uint16_t *)((long)buckets + (uVar10 & 0xffffffff) * 2) + 1;
            puStack_8c0[local_8d8] = (uint32_t)num;
            num_1 = (uint16_t *)(local_1318 - 2);
            local_910 = local_1300;
            local_918 = local_1308;
            buckets_1 = (uint32_t *)(local_12f8->privat)._H6.num_;
            puStack_930 = (local_12f8->privat)._H6.buckets_;
            local_8e8 = (ulong *)(local_1300 + ((ulong)num_1 & local_1308));
            local_8f0 = (local_12f8->privat)._H6.hash_mask_;
            h_1._4_4_ = (local_12f8->privat)._H35.hb.state;
            local_900 = (*local_8e8 & local_8f0) * 0x1fe35a7bd3579bd3;
            uVar10 = local_900 >> ((byte)h_1._4_4_ & 0x3f);
            minor_ix_4._4_4_ = (int)uVar10;
            offset_4 = (size_t)((uint)*(ushort *)((long)buckets_1 + (uVar10 & 0xffffffff) * 2) &
                               (local_12f8->privat)._H6.block_mask_);
            local_948 = offset_4 +
                        (uint)(minor_ix_4._4_4_ <<
                              ((byte)*(undefined4 *)
                                      ((long)&(local_12f8->privat)._H35.hb.next_ix + 4) & 0x1f));
            *(uint16_t *)((long)buckets_1 + (uVar10 & 0xffffffff) * 2) =
                 *(uint16_t *)((long)buckets_1 + (uVar10 & 0xffffffff) * 2) + 1;
            puStack_930[local_948] = (uint32_t)num_1;
            num_2 = (uint16_t *)(local_1318 - 1);
            local_980 = local_1300;
            local_988 = local_1308;
            buckets_2 = (uint32_t *)(local_12f8->privat)._H6.num_;
            puStack_9a0 = (local_12f8->privat)._H6.buckets_;
            local_958 = (ulong *)(local_1300 + ((ulong)num_2 & local_1308));
            local_960 = (local_12f8->privat)._H6.hash_mask_;
            h_2._4_4_ = (local_12f8->privat)._H35.hb.state;
            local_970 = (*local_958 & local_960) * 0x1fe35a7bd3579bd3;
            uVar10 = local_970 >> ((byte)h_2._4_4_ & 0x3f);
            minor_ix_5._4_4_ = (int)uVar10;
            offset_5 = (size_t)((uint)*(ushort *)((long)buckets_2 + (uVar10 & 0xffffffff) * 2) &
                               (local_12f8->privat)._H6.block_mask_);
            local_9b8 = offset_5 +
                        (uint)(minor_ix_5._4_4_ <<
                              ((byte)*(undefined4 *)
                                      ((long)&(local_12f8->privat)._H35.hb.next_ix + 4) & 0x1f));
            *(uint16_t *)((long)buckets_2 + (uVar10 & 0xffffffff) * 2) =
                 *(uint16_t *)((long)buckets_2 + (uVar10 & 0xffffffff) * 2) + 1;
            puStack_9a0[local_9b8] = (uint32_t)num_2;
            local_978 = local_1170;
            local_950 = local_958;
            local_908 = local_1170;
            local_8e0 = local_8e8;
            local_898 = local_1170;
            local_870 = local_878;
          }
          break;
        default:
          break;
        case 10:
          local_12a8 = &local_12f8->privat;
          local_12b0 = local_1320;
          local_12b8 = local_1318;
          local_12c0 = local_1300;
          i_start = local_1308;
          if ((2 < local_1320) && (0x7f < local_1318)) {
            max_backward = local_1318 - 0x7f;
            local_12a0 = max_backward + local_1320;
            local_1298 = local_1318;
            local_1450 = local_12a0;
            if (local_1318 < local_12a0) {
              local_1450 = local_1318;
            }
            i = local_1450;
            i_end = max_backward;
            for (; max_backward < i; max_backward = max_backward + 1) {
              local_1290 = local_12b8 - max_backward;
              local_1288 = 0xf;
              local_1460 = local_1290;
              if (local_1290 < 0xf) {
                local_1460 = 0xf;
              }
              local_12e8 = (long)(local_12a8->_H2).common - local_1460;
              local_1d8 = local_12a8;
              local_1e0 = local_12c0;
              local_1e8 = max_backward;
              local_1f0 = i_start;
              local_1f8 = 0x80;
              local_208 = (ulong *)0x0;
              cur_ix_masked = 0;
              max_comp_len = max_backward & i_start;
              local_1b8 = 0x80;
              local_1c0 = 0x80;
              _key_36 = 0x80;
              buckets_6._4_4_ = 1;
              local_200 = local_12e8;
              buckets_6._0_4_ = HashBytesH10(local_12c0 + max_comp_len);
              forest = (local_1d8->_H2).buckets_;
              prev_ix = (size_t)(local_1d8->_H40).common;
              uVar4 = forest[(uint32_t)buckets_6];
              local_188 = local_1d8;
              local_190 = local_1e8;
              node_right = (local_1e8 & (local_1d8->_H5).bucket_size_) << 1;
              local_158 = local_1d8;
              local_160 = local_1e8;
              best_len_left = (local_1e8 & (local_1d8->_H5).bucket_size_) * 2 + 1;
              best_len_right = 0;
              depth_remaining = 0;
              if (buckets_6._4_4_ != 0) {
                forest[(uint32_t)buckets_6] = (uint32_t)local_1e8;
              }
              backward = 0x40;
              while( true ) {
                node_left = (size_t)uVar4;
                prev_ix_masked = local_1e8 - node_left;
                cur_len = node_left & local_1f0;
                if (((prev_ix_masked == 0) || (local_200 < prev_ix_masked)) || (backward == 0))
                break;
                local_1c8 = best_len_right;
                local_1d0 = depth_remaining;
                if (best_len_right < depth_remaining) {
                  local_1470 = best_len_right;
                }
                else {
                  local_1470 = depth_remaining;
                }
                len = local_1470;
                local_120 = local_1e0 + max_comp_len + local_1470;
                local_128 = (ulong *)(local_1e0 + cur_len + local_1470);
                matched = local_1f8 - local_1470;
                limit2 = 0;
                x = (matched >> 3) + 1;
LAB_001914ed:
                x = x - 1;
                if (x != 0) {
                  local_f8 = local_128;
                  local_100 = (ulong *)(local_120 + limit2);
                  if (*local_128 == *local_100) goto LAB_0019154f;
                  local_108 = local_128;
                  local_110 = (ulong *)(local_120 + limit2);
                  iVar6 = 0;
                  matching_bits = *local_128 ^ *local_110;
                  for (uVar10 = matching_bits; (uVar10 & 1) == 0;
                      uVar10 = uVar10 >> 1 | 0x8000000000000000) {
                    iVar6 = iVar6 + 1;
                  }
                  local_150 = (ulong)iVar6;
                  local_118 = (local_150 >> 3) + limit2;
                  goto LAB_00191690;
                }
                matched = (matched & 7) + 1;
                while (matched = matched - 1, matched != 0) {
                  if (local_120[limit2] != (uint8_t)*local_128) {
                    local_118 = limit2;
                    goto LAB_00191690;
                  }
                  local_128 = (ulong *)((long)local_128 + 1);
                  limit2 = limit2 + 1;
                }
                local_118 = limit2;
LAB_00191690:
                local_288 = local_1470 + local_118;
                if ((cur_ix_masked != 0) && (*local_208 < local_288)) {
                  *local_208 = local_288;
                  local_e0 = cur_ix_masked;
                  *(int *)cur_ix_masked = (int)prev_ix_masked;
                  *(int *)(cur_ix_masked + 4) = (int)local_288 * 0x20;
                  cur_ix_masked = cur_ix_masked + 8;
                  local_f0 = local_288;
                  local_e8 = prev_ix_masked;
                }
                limit2 = local_118;
                if (_key_36 <= local_288) {
                  if (buckets_6._4_4_ != 0) {
                    local_1a8 = local_1d8;
                    local_1b0 = node_left;
                    *(undefined4 *)((long)&((HasherCommon *)prev_ix)->extra + node_right * 4) =
                         *(undefined4 *)
                          (&((HasherCommon *)prev_ix)->extra +
                          (node_left & (local_1d8->_H5).bucket_size_));
                    local_178 = local_1d8;
                    local_180 = node_left;
                    *(undefined4 *)((long)&((HasherCommon *)prev_ix)->extra + best_len_left * 4) =
                         *(undefined4 *)
                          ((long)&((HasherCommon *)prev_ix)->extra +
                          (node_left & (local_1d8->_H5).bucket_size_) * 8 + 4);
                  }
                  goto LAB_0019194f;
                }
                if (local_1e0[cur_len + local_288] < local_1e0[max_comp_len + local_288]) {
                  if (buckets_6._4_4_ != 0) {
                    *(uint *)((long)&((HasherCommon *)prev_ix)->extra + node_right * 4) = uVar4;
                  }
                  local_168 = local_1d8;
                  local_170 = node_left;
                  uVar10 = node_left & (local_1d8->_H5).bucket_size_;
                  node_right = uVar10 * 2 + 1;
                  uVar4 = *(uint *)((long)&((HasherCommon *)prev_ix)->extra + uVar10 * 8 + 4);
                  best_len_right = local_288;
                }
                else {
                  if (buckets_6._4_4_ != 0) {
                    *(uint *)((long)&((HasherCommon *)prev_ix)->extra + best_len_left * 4) = uVar4;
                  }
                  local_198 = local_1d8;
                  local_1a0 = node_left;
                  uVar10 = node_left & (local_1d8->_H5).bucket_size_;
                  best_len_left = uVar10 * 2;
                  uVar4 = *(uint *)(&((HasherCommon *)prev_ix)->extra + uVar10);
                  depth_remaining = local_288;
                }
                backward = backward - 1;
              }
              if (buckets_6._4_4_ != 0) {
                *(int *)((long)&((HasherCommon *)prev_ix)->extra + node_right * 4) =
                     (local_1d8->_H5).hash_shift_;
                *(int *)((long)&((HasherCommon *)prev_ix)->extra + best_len_left * 4) =
                     (local_1d8->_H5).hash_shift_;
              }
LAB_0019194f:
            }
          }
          break;
        case 0x23:
          local_10a8 = &local_12f8->privat;
          local_10b0 = local_1320;
          local_10b8 = local_1318;
          local_10c0 = local_1300;
          local_10c8 = local_1308;
          local_1088 = local_1320;
          local_1090 = local_1318;
          local_1098 = local_1300;
          local_10a0 = local_1308;
          local_1080 = local_10a8;
          if ((6 < local_1320) && (2 < local_1318)) {
            _off_9 = local_1318 - 3;
            local_cb0 = local_1300;
            local_cb8 = local_1308;
            local_ca8 = local_10a8;
            local_cc4 = HashBytesH3(local_1300 + (_off_9 & local_1308));
            local_cc8 = (uint)_off_9 & 8;
            (local_ca8->_H2).buckets_[local_cc4 + local_cc8 & 0xffff] = (uint)_off_9;
            _off_10 = local_1090 - 2;
            local_cd0 = local_1080;
            local_cd8 = local_1098;
            local_ce0 = local_10a0;
            local_cec = HashBytesH3(local_1098 + (_off_10 & local_10a0));
            local_cf0 = (uint)_off_10 & 8;
            (local_cd0->_H2).buckets_[local_cec + local_cf0 & 0xffff] = (uint)_off_10;
            _off_11 = local_1090 - 1;
            local_cf8 = local_1080;
            local_d00 = local_1098;
            local_d08 = local_10a0;
            local_d14 = HashBytesH3(local_1098 + (_off_11 & local_10a0));
            local_d18 = (uint)_off_11 & 8;
            (local_cf8->_H2).buckets_[local_d14 + local_d18 & 0xffff] = (uint)_off_11;
          }
          local_2c8 = &(local_10a8->_H35).hb;
          local_2d0 = local_10b0;
          local_2d8 = local_10b8;
          local_2e0 = local_10c0;
          position_masked = local_10c8;
          diff = local_10b0;
          if ((local_10b8 & 3) != 0) {
            local_300 = 4 - (local_10b8 & 3);
            if (local_10b0 < local_300) {
              local_1440 = 0;
            }
            else {
              local_1440 = local_10b0 - local_300;
            }
            diff = local_1440;
            local_2d8 = local_300 + local_10b8;
          }
          available = local_2d8 & local_10c8;
          if (local_10c8 - available < diff) {
            diff = local_10c8 - available;
          }
          PrepareHROLLING_FAST(local_2c8,0,diff,local_10c0 + (local_2d8 & local_10c8));
          local_2c8->next_ix = local_2d8;
          break;
        case 0x28:
          local_1148 = &local_12f8->privat;
          local_1150 = local_1320;
          local_1158 = local_1318;
          local_1160 = local_1300;
          local_1168 = local_1308;
          if ((2 < local_1320) && (2 < local_1318)) {
            addr = (uint32_t *)(local_1318 - 3);
            local_728 = local_1300;
            local_730 = local_1308;
            local_720 = local_1148;
            head = (uint16_t *)AddrH40((local_12f8->privat)._H40.extra);
            tiny_hash = (uint8_t *)HeadH40((local_720->_H40).extra);
            banks = (BankH40 *)TinyHashH40((local_720->_H40).extra);
            key_15 = (size_t)BanksH40((local_720->_H40).extra);
            piStack_710 = (int *)(local_728 + ((ulong)addr & local_730));
            local_714 = *piStack_710 * 0x1e35a7bd;
            bank = (size_t)(local_714 >> 0x11);
            idx = 0;
            uVar1 = (local_720->_H40).free_slot_idx[0];
            (local_720->_H40).free_slot_idx[0] = uVar1 + 1;
            delta_1 = (size_t)(int)(uint)uVar1;
            local_778 = (long)addr - (ulong)*(uint *)(head + bank * 2);
            *(char *)((long)&banks->slots[0].delta + ((ulong)addr & 0xffff)) =
                 (char)(local_714 >> 0x11);
            if (0xffff < local_778) {
              local_778 = 0xffff;
            }
            ((BankH40 *)key_15)->slots[delta_1].delta = (uint16_t)local_778;
            ((BankH40 *)key_15)->slots[delta_1].next = *(uint16_t *)(tiny_hash + bank * 2);
            *(int *)(head + bank * 2) = (int)addr;
            *(ushort *)(tiny_hash + bank * 2) = uVar1;
            addr_1 = (uint32_t *)(local_1158 - 2);
            local_798 = local_1148;
            local_7a0 = local_1160;
            local_7a8 = local_1168;
            local_708 = piStack_710;
            head_1 = (uint16_t *)AddrH40((local_1148->_H40).extra);
            tiny_hash_1 = (uint8_t *)HeadH40((local_798->_H40).extra);
            banks_1 = (BankH40 *)TinyHashH40((local_798->_H40).extra);
            key_16 = (size_t)BanksH40((local_798->_H40).extra);
            piStack_788 = (int *)(local_7a0 + ((ulong)addr_1 & local_7a8));
            local_78c = *piStack_788 * 0x1e35a7bd;
            bank_1 = (size_t)(local_78c >> 0x11);
            idx_1 = 0;
            uVar1 = (local_798->_H40).free_slot_idx[0];
            (local_798->_H40).free_slot_idx[0] = uVar1 + 1;
            delta_2 = (size_t)(int)(uint)uVar1;
            local_7f0 = (long)addr_1 - (ulong)*(uint *)(head_1 + bank_1 * 2);
            *(char *)((long)&banks_1->slots[0].delta + ((ulong)addr_1 & 0xffff)) =
                 (char)(local_78c >> 0x11);
            if (0xffff < local_7f0) {
              local_7f0 = 0xffff;
            }
            ((BankH40 *)key_16)->slots[delta_2].delta = (uint16_t)local_7f0;
            ((BankH40 *)key_16)->slots[delta_2].next = *(uint16_t *)(tiny_hash_1 + bank_1 * 2);
            *(int *)(head_1 + bank_1 * 2) = (int)addr_1;
            *(ushort *)(tiny_hash_1 + bank_1 * 2) = uVar1;
            addr_2 = (uint32_t *)(local_1158 - 1);
            local_810 = local_1148;
            local_818 = local_1160;
            local_820 = local_1168;
            local_780 = piStack_788;
            head_2 = (uint16_t *)AddrH40((local_1148->_H40).extra);
            tiny_hash_2 = (uint8_t *)HeadH40((local_810->_H40).extra);
            banks_2 = (BankH40 *)TinyHashH40((local_810->_H40).extra);
            key_17 = (size_t)BanksH40((local_810->_H40).extra);
            piStack_800 = (int *)(local_818 + ((ulong)addr_2 & local_820));
            local_804 = *piStack_800 * 0x1e35a7bd;
            bank_2 = (size_t)(local_804 >> 0x11);
            idx_2 = 0;
            uVar1 = (local_810->_H40).free_slot_idx[0];
            (local_810->_H40).free_slot_idx[0] = uVar1 + 1;
            delta_3 = (size_t)(int)(uint)uVar1;
            local_868 = (long)addr_2 - (ulong)*(uint *)(head_2 + bank_2 * 2);
            *(char *)((long)&banks_2->slots[0].delta + ((ulong)addr_2 & 0xffff)) =
                 (char)(local_804 >> 0x11);
            if (0xffff < local_868) {
              local_868 = 0xffff;
            }
            ((BankH40 *)key_17)->slots[delta_3].delta = (uint16_t)local_868;
            ((BankH40 *)key_17)->slots[delta_3].next = *(uint16_t *)(tiny_hash_2 + bank_2 * 2);
            *(int *)(head_2 + bank_2 * 2) = (int)addr_2;
            *(ushort *)(tiny_hash_2 + bank_2 * 2) = uVar1;
            local_7f8 = piStack_800;
          }
          break;
        case 0x29:
          local_1120 = &local_12f8->privat;
          local_1128 = local_1320;
          local_1130 = local_1318;
          local_1138 = local_1300;
          local_1140 = local_1308;
          if ((2 < local_1320) && (2 < local_1318)) {
            addr_3 = (uint32_t *)(local_1318 - 3);
            local_5c0 = local_1300;
            local_5c8 = local_1308;
            local_5b8 = local_1120;
            head_3 = (uint16_t *)AddrH41((local_12f8->privat)._H40.extra);
            tiny_hash_3 = (uint8_t *)HeadH41((local_5b8->_H40).extra);
            banks_3 = (BankH41 *)TinyHashH41((local_5b8->_H40).extra);
            key_18 = (size_t)BanksH41((local_5b8->_H40).extra);
            piStack_5a8 = (int *)(local_5c0 + ((ulong)addr_3 & local_5c8));
            local_5ac = *piStack_5a8 * 0x1e35a7bd;
            bank_3 = (size_t)(local_5ac >> 0x11);
            idx_3 = 0;
            uVar1 = (local_5b8->_H40).free_slot_idx[0];
            (local_5b8->_H40).free_slot_idx[0] = uVar1 + 1;
            delta_4 = (size_t)(int)(uint)uVar1;
            local_610 = (long)addr_3 - (ulong)*(uint *)(head_3 + bank_3 * 2);
            *(char *)((long)&banks_3->slots[0].delta + ((ulong)addr_3 & 0xffff)) =
                 (char)(local_5ac >> 0x11);
            if (0xffff < local_610) {
              local_610 = 0xffff;
            }
            ((BankH41 *)key_18)->slots[delta_4].delta = (uint16_t)local_610;
            ((BankH41 *)key_18)->slots[delta_4].next = *(uint16_t *)(tiny_hash_3 + bank_3 * 2);
            *(int *)(head_3 + bank_3 * 2) = (int)addr_3;
            *(ushort *)(tiny_hash_3 + bank_3 * 2) = uVar1;
            addr_4 = (uint32_t *)(local_1130 - 2);
            local_630 = local_1120;
            local_638 = local_1138;
            local_640 = local_1140;
            local_5a0 = piStack_5a8;
            head_4 = (uint16_t *)AddrH41((local_1120->_H40).extra);
            tiny_hash_4 = (uint8_t *)HeadH41((local_630->_H40).extra);
            banks_4 = (BankH41 *)TinyHashH41((local_630->_H40).extra);
            key_19 = (size_t)BanksH41((local_630->_H40).extra);
            piStack_620 = (int *)(local_638 + ((ulong)addr_4 & local_640));
            local_624 = *piStack_620 * 0x1e35a7bd;
            bank_4 = (size_t)(local_624 >> 0x11);
            idx_4 = 0;
            uVar1 = (local_630->_H40).free_slot_idx[0];
            (local_630->_H40).free_slot_idx[0] = uVar1 + 1;
            delta_5 = (size_t)(int)(uint)uVar1;
            local_688 = (long)addr_4 - (ulong)*(uint *)(head_4 + bank_4 * 2);
            *(char *)((long)&banks_4->slots[0].delta + ((ulong)addr_4 & 0xffff)) =
                 (char)(local_624 >> 0x11);
            if (0xffff < local_688) {
              local_688 = 0xffff;
            }
            ((BankH41 *)key_19)->slots[delta_5].delta = (uint16_t)local_688;
            ((BankH41 *)key_19)->slots[delta_5].next = *(uint16_t *)(tiny_hash_4 + bank_4 * 2);
            *(int *)(head_4 + bank_4 * 2) = (int)addr_4;
            *(ushort *)(tiny_hash_4 + bank_4 * 2) = uVar1;
            addr_5 = (uint32_t *)(local_1130 - 1);
            local_6a8 = local_1120;
            local_6b0 = local_1138;
            local_6b8 = local_1140;
            local_618 = piStack_620;
            head_5 = (uint16_t *)AddrH41((local_1120->_H40).extra);
            tiny_hash_5 = (uint8_t *)HeadH41((local_6a8->_H40).extra);
            banks_5 = (BankH41 *)TinyHashH41((local_6a8->_H40).extra);
            key_20 = (size_t)BanksH41((local_6a8->_H40).extra);
            piStack_698 = (int *)(local_6b0 + ((ulong)addr_5 & local_6b8));
            local_69c = *piStack_698 * 0x1e35a7bd;
            bank_5 = (size_t)(local_69c >> 0x11);
            idx_5 = 0;
            uVar1 = (local_6a8->_H40).free_slot_idx[0];
            (local_6a8->_H40).free_slot_idx[0] = uVar1 + 1;
            delta_6 = (size_t)(int)(uint)uVar1;
            local_700 = (long)addr_5 - (ulong)*(uint *)(head_5 + bank_5 * 2);
            *(char *)((long)&banks_5->slots[0].delta + ((ulong)addr_5 & 0xffff)) =
                 (char)(local_69c >> 0x11);
            if (0xffff < local_700) {
              local_700 = 0xffff;
            }
            ((BankH41 *)key_20)->slots[delta_6].delta = (uint16_t)local_700;
            ((BankH41 *)key_20)->slots[delta_6].next = *(uint16_t *)(tiny_hash_5 + bank_5 * 2);
            *(int *)(head_5 + bank_5 * 2) = (int)addr_5;
            *(ushort *)(tiny_hash_5 + bank_5 * 2) = uVar1;
            local_690 = piStack_698;
          }
          break;
        case 0x2a:
          local_10f8 = &local_12f8->privat;
          local_1100 = local_1320;
          local_1108 = local_1318;
          local_1110 = local_1300;
          local_1118 = local_1308;
          if ((2 < local_1320) && (2 < local_1318)) {
            addr_6 = (uint32_t *)(local_1318 - 3);
            local_458 = local_1300;
            local_460 = local_1308;
            local_450 = local_10f8;
            head_6 = (uint16_t *)AddrH42((local_12f8->privat)._H42.extra);
            tiny_hash_6 = (uint8_t *)HeadH42((local_450->_H42).extra);
            banks_6 = (BankH42 *)TinyHashH42((local_450->_H42).extra);
            key_21 = (size_t)BanksH42((local_450->_H42).extra);
            piStack_440 = (int *)(local_458 + ((ulong)addr_6 & local_460));
            local_444 = *piStack_440 * 0x1e35a7bd;
            bank_6 = (size_t)(local_444 >> 0x11);
            idx_6 = bank_6 & 0x1ff;
            uVar1 = *(ushort *)((long)local_450 + idx_6 * 2);
            *(ushort *)((long)local_450 + idx_6 * 2) = uVar1 + 1;
            uVar4 = uVar1 & 0x1ff;
            delta_7 = (size_t)(int)uVar4;
            local_4a8 = (long)addr_6 - (ulong)*(uint *)(head_6 + bank_6 * 2);
            *(char *)((long)&banks_6->slots[0].delta + ((ulong)addr_6 & 0xffff)) =
                 (char)(local_444 >> 0x11);
            if (0xffff < local_4a8) {
              local_4a8 = 0xffff;
            }
            ((BankH42 *)(key_21 + idx_6 * 0x800))->slots[delta_7].delta = (uint16_t)local_4a8;
            ((BankH42 *)(key_21 + idx_6 * 0x800))->slots[delta_7].next =
                 *(uint16_t *)(tiny_hash_6 + bank_6 * 2);
            *(int *)(head_6 + bank_6 * 2) = (int)addr_6;
            *(short *)(tiny_hash_6 + bank_6 * 2) = (short)uVar4;
            addr_7 = (uint32_t *)(local_1108 - 2);
            local_4c8 = local_10f8;
            local_4d0 = local_1110;
            local_4d8 = local_1118;
            local_438 = piStack_440;
            head_7 = (uint16_t *)AddrH42((local_10f8->_H42).extra);
            tiny_hash_7 = (uint8_t *)HeadH42((local_4c8->_H42).extra);
            banks_7 = (BankH42 *)TinyHashH42((local_4c8->_H42).extra);
            key_22 = (size_t)BanksH42((local_4c8->_H42).extra);
            piStack_4b8 = (int *)(local_4d0 + ((ulong)addr_7 & local_4d8));
            local_4bc = *piStack_4b8 * 0x1e35a7bd;
            bank_7 = (size_t)(local_4bc >> 0x11);
            idx_7 = bank_7 & 0x1ff;
            uVar1 = *(ushort *)((long)local_4c8 + idx_7 * 2);
            *(ushort *)((long)local_4c8 + idx_7 * 2) = uVar1 + 1;
            uVar4 = uVar1 & 0x1ff;
            delta_8 = (size_t)(int)uVar4;
            local_520 = (long)addr_7 - (ulong)*(uint *)(head_7 + bank_7 * 2);
            *(char *)((long)&banks_7->slots[0].delta + ((ulong)addr_7 & 0xffff)) =
                 (char)(local_4bc >> 0x11);
            if (0xffff < local_520) {
              local_520 = 0xffff;
            }
            ((BankH42 *)(key_22 + idx_7 * 0x800))->slots[delta_8].delta = (uint16_t)local_520;
            ((BankH42 *)(key_22 + idx_7 * 0x800))->slots[delta_8].next =
                 *(uint16_t *)(tiny_hash_7 + bank_7 * 2);
            *(int *)(head_7 + bank_7 * 2) = (int)addr_7;
            *(short *)(tiny_hash_7 + bank_7 * 2) = (short)uVar4;
            addr_8 = (uint32_t *)(local_1108 - 1);
            local_540 = local_10f8;
            local_548 = local_1110;
            local_550 = local_1118;
            local_4b0 = piStack_4b8;
            head_8 = (uint16_t *)AddrH42((local_10f8->_H42).extra);
            tiny_hash_8 = (uint8_t *)HeadH42((local_540->_H42).extra);
            banks_8 = (BankH42 *)TinyHashH42((local_540->_H42).extra);
            key_23 = (size_t)BanksH42((local_540->_H42).extra);
            piStack_530 = (int *)(local_548 + ((ulong)addr_8 & local_550));
            local_534 = *piStack_530 * 0x1e35a7bd;
            bank_8 = (size_t)(local_534 >> 0x11);
            idx_8 = bank_8 & 0x1ff;
            uVar1 = *(ushort *)((long)local_540 + idx_8 * 2);
            *(ushort *)((long)local_540 + idx_8 * 2) = uVar1 + 1;
            uVar4 = uVar1 & 0x1ff;
            delta_9 = (size_t)(int)uVar4;
            local_598 = (long)addr_8 - (ulong)*(uint *)(head_8 + bank_8 * 2);
            *(char *)((long)&banks_8->slots[0].delta + ((ulong)addr_8 & 0xffff)) =
                 (char)(local_534 >> 0x11);
            if (0xffff < local_598) {
              local_598 = 0xffff;
            }
            ((BankH42 *)(key_23 + idx_8 * 0x800))->slots[delta_9].delta = (uint16_t)local_598;
            ((BankH42 *)(key_23 + idx_8 * 0x800))->slots[delta_9].next =
                 *(uint16_t *)(tiny_hash_8 + bank_8 * 2);
            *(int *)(head_8 + bank_8 * 2) = (int)addr_8;
            *(short *)(tiny_hash_8 + bank_8 * 2) = (short)uVar4;
            local_528 = piStack_530;
          }
          break;
        case 0x36:
          local_10d0 = &local_12f8->privat;
          local_10d8 = local_1320;
          local_10e0 = local_1318;
          local_10e8 = local_1300;
          local_10f0 = local_1308;
          if ((6 < local_1320) && (2 < local_1318)) {
            _off_6 = local_1318 - 3;
            local_350 = local_1300;
            local_358 = local_1308;
            local_348 = local_10d0;
            local_364 = HashBytesH54(local_1300 + (_off_6 & local_1308));
            local_368 = (uint)_off_6 & 0x18;
            (local_348->_H2).buckets_[local_364 + local_368 & 0xfffff] = (uint)_off_6;
            _off_7 = local_10e0 - 2;
            local_370 = local_10d0;
            local_378 = local_10e8;
            local_380 = local_10f0;
            local_38c = HashBytesH54(local_10e8 + (_off_7 & local_10f0));
            local_390 = (uint)_off_7 & 0x18;
            (local_370->_H2).buckets_[local_38c + local_390 & 0xfffff] = (uint)_off_7;
            _off_8 = local_10e0 - 1;
            local_398 = local_10d0;
            local_3a0 = local_10e8;
            local_3a8 = local_10f0;
            local_3b4 = HashBytesH54(local_10e8 + (_off_8 & local_10f0));
            local_3b8 = (uint)_off_8 & 0x18;
            (local_398->_H2).buckets_[local_3b4 + local_3b8 & 0xfffff] = (uint)_off_8;
          }
          break;
        case 0x37:
          local_1058 = &local_12f8->privat;
          local_1060 = local_1320;
          local_1068 = local_1318;
          local_1070 = local_1300;
          local_1078 = local_1308;
          local_1038 = local_1320;
          local_1040 = local_1318;
          local_1048 = local_1300;
          local_1050 = local_1308;
          local_1030 = local_1058;
          if ((6 < local_1320) && (2 < local_1318)) {
            _off_12 = local_1318 - 3;
            local_3c8 = local_1300;
            local_3d0 = local_1308;
            local_3c0 = local_1058;
            local_3dc = HashBytesH54(local_1300 + (_off_12 & local_1308));
            local_3e0 = (uint)_off_12 & 0x18;
            (local_3c0->_H2).buckets_[local_3dc + local_3e0 & 0xfffff] = (uint)_off_12;
            _off_13 = local_1040 - 2;
            local_3e8 = local_1030;
            local_3f0 = local_1048;
            local_3f8 = local_1050;
            local_404 = HashBytesH54(local_1048 + (_off_13 & local_1050));
            local_408 = (uint)_off_13 & 0x18;
            (local_3e8->_H2).buckets_[local_404 + local_408 & 0xfffff] = (uint)_off_13;
            _off_14 = local_1040 - 1;
            local_410 = local_1030;
            local_418 = local_1048;
            local_420 = local_1050;
            local_42c = HashBytesH54(local_1048 + (_off_14 & local_1050));
            local_430 = (uint)_off_14 & 0x18;
            (local_410->_H2).buckets_[local_42c + local_430 & 0xfffff] = (uint)_off_14;
          }
          local_308 = &(local_1058->_H35).hb;
          local_310 = local_1060;
          local_318 = local_1068;
          local_320 = local_1070;
          position_masked_1 = local_1078;
          diff_1 = local_1060;
          if ((local_1068 & 3) != 0) {
            local_340 = 4 - (local_1068 & 3);
            if (local_1060 < local_340) {
              local_1448 = 0;
            }
            else {
              local_1448 = local_1060 - local_340;
            }
            diff_1 = local_1448;
            local_318 = local_340 + local_1068;
          }
          available_1 = local_318 & local_1078;
          if (local_1078 - available_1 < diff_1) {
            diff_1 = local_1078 - available_1;
          }
          PrepareHROLLING_FAST(local_308,0,diff_1,local_1070 + (local_318 & local_1078));
          local_308->next_ix = local_318;
          break;
        case 0x41:
          local_1008 = &local_12f8->privat;
          local_1010 = local_1320;
          local_1018 = local_1318;
          local_1020 = local_1300;
          local_1028 = local_1308;
          local_fe8 = local_1320;
          local_ff0 = local_1318;
          local_ff8 = local_1300;
          local_1000 = local_1308;
          if ((6 < local_1320) && (2 < local_1318)) {
            num_3 = (uint16_t *)(local_1318 - 3);
            local_9f0 = local_1300;
            local_9f8 = local_1308;
            buckets_3 = (uint32_t *)(local_12f8->privat)._H6.num_;
            puStack_a10 = (local_12f8->privat)._H6.buckets_;
            local_9c8 = (ulong *)(local_1300 + ((ulong)num_3 & local_1308));
            local_9d0 = (local_12f8->privat)._H6.hash_mask_;
            h_12._4_4_ = (local_12f8->privat)._H35.hb.state;
            local_9e0 = (*local_9c8 & local_9d0) * 0x1fe35a7bd3579bd3;
            uVar10 = local_9e0 >> ((byte)h_12._4_4_ & 0x3f);
            minor_ix_6._4_4_ = (int)uVar10;
            offset_6 = (size_t)((uint)*(ushort *)((long)buckets_3 + (uVar10 & 0xffffffff) * 2) &
                               (local_12f8->privat)._H6.block_mask_);
            local_a28 = offset_6 +
                        (uint)(minor_ix_6._4_4_ <<
                              ((byte)*(undefined4 *)
                                      ((long)&(local_12f8->privat)._H35.hb.next_ix + 4) & 0x1f));
            *(uint16_t *)((long)buckets_3 + (uVar10 & 0xffffffff) * 2) =
                 *(uint16_t *)((long)buckets_3 + (uVar10 & 0xffffffff) * 2) + 1;
            puStack_a10[local_a28] = (uint32_t)num_3;
            num_4 = (uint16_t *)(local_1318 - 2);
            local_a60 = local_1300;
            local_a68 = local_1308;
            buckets_4 = (uint32_t *)(local_12f8->privat)._H6.num_;
            puStack_a80 = (local_12f8->privat)._H6.buckets_;
            local_a38 = (ulong *)(local_1300 + ((ulong)num_4 & local_1308));
            local_a40 = (local_12f8->privat)._H6.hash_mask_;
            h_13._4_4_ = (local_12f8->privat)._H35.hb.state;
            local_a50 = (*local_a38 & local_a40) * 0x1fe35a7bd3579bd3;
            uVar10 = local_a50 >> ((byte)h_13._4_4_ & 0x3f);
            minor_ix_7._4_4_ = (int)uVar10;
            offset_7 = (size_t)((uint)*(ushort *)((long)buckets_4 + (uVar10 & 0xffffffff) * 2) &
                               (local_12f8->privat)._H6.block_mask_);
            local_a98 = offset_7 +
                        (uint)(minor_ix_7._4_4_ <<
                              ((byte)*(undefined4 *)
                                      ((long)&(local_12f8->privat)._H35.hb.next_ix + 4) & 0x1f));
            *(uint16_t *)((long)buckets_4 + (uVar10 & 0xffffffff) * 2) =
                 *(uint16_t *)((long)buckets_4 + (uVar10 & 0xffffffff) * 2) + 1;
            puStack_a80[local_a98] = (uint32_t)num_4;
            num_5 = (uint16_t *)(local_1318 - 1);
            local_ad0 = local_1300;
            local_ad8 = local_1308;
            buckets_5 = (uint32_t *)(local_12f8->privat)._H6.num_;
            puStack_af0 = (local_12f8->privat)._H6.buckets_;
            local_aa8 = (ulong *)(local_1300 + ((ulong)num_5 & local_1308));
            local_ab0 = (local_12f8->privat)._H6.hash_mask_;
            h_14._4_4_ = (local_12f8->privat)._H35.hb.state;
            local_ac0 = (*local_aa8 & local_ab0) * 0x1fe35a7bd3579bd3;
            uVar10 = local_ac0 >> ((byte)h_14._4_4_ & 0x3f);
            minor_ix_8._4_4_ = (int)uVar10;
            offset_8 = (size_t)((uint)*(ushort *)((long)buckets_5 + (uVar10 & 0xffffffff) * 2) &
                               (local_12f8->privat)._H6.block_mask_);
            local_b08 = offset_8 +
                        (uint)(minor_ix_8._4_4_ <<
                              ((byte)*(undefined4 *)
                                      ((long)&(local_12f8->privat)._H35.hb.next_ix + 4) & 0x1f));
            *(uint16_t *)((long)buckets_5 + (uVar10 & 0xffffffff) * 2) =
                 *(uint16_t *)((long)buckets_5 + (uVar10 & 0xffffffff) * 2) + 1;
            puStack_af0[local_b08] = (uint32_t)num_5;
            local_ac8 = local_1008;
            local_aa0 = local_aa8;
            local_a58 = local_1008;
            local_a30 = local_a38;
            local_9e8 = local_1008;
            local_9c0 = local_9c8;
          }
          local_290 = &(local_12f8->privat)._H65.hb;
          local_298 = local_1320;
          local_2a0 = local_1318;
          local_2a8 = local_1300;
          position_masked_2 = local_1308;
          local_2c0 = local_1320;
          available_2 = local_1318 & local_1308;
          if (local_1308 - available_2 < local_1320) {
            local_2c0 = local_1308 - available_2;
          }
          local_fe0 = local_1008;
          PrepareHROLLING(local_290,0,local_2c0,local_1300 + (local_1318 & local_1308));
          local_290->next_ix = local_2a0;
        }
        params = _force_flush_local;
        puVar9 = puStack_1360;
        uVar5 = WrapPosition(_force_flush_local->last_flush_pos_);
        literal_context_lut._4_4_ =
             ChooseContextMode(&params->params,puVar9,(ulong)uVar5,(ulong)m._4_4_,
                               _force_flush_local->input_pos_ - _force_flush_local->last_flush_pos_)
        ;
        storage = "" + (literal_context_lut._4_4_ << 9);
        if ((_force_flush_local->num_commands_ != 0) && (_force_flush_local->last_insert_len_ == 0))
        {
          ExtendLastCommand(_force_flush_local,(uint32_t *)((long)&data + 4),(uint32_t *)&data);
        }
        if ((_force_flush_local->params).quality == 10) {
          BrotliCreateZopfliBackwardReferences
                    (pMStack_1370,(ulong)data._4_4_,(ulong)(uint32_t)data,puStack_1360,
                     (ulong)m._4_4_,storage,&_force_flush_local->params,&_force_flush_local->hasher_
                     ,_force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                     _force_flush_local->commands_ + _force_flush_local->num_commands_,
                     &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
        }
        else if ((_force_flush_local->params).quality == 0xb) {
          BrotliCreateHqZopfliBackwardReferences
                    (pMStack_1370,(ulong)data._4_4_,(ulong)(uint32_t)data,puStack_1360,
                     (ulong)m._4_4_,storage,&_force_flush_local->params,&_force_flush_local->hasher_
                     ,_force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                     _force_flush_local->commands_ + _force_flush_local->num_commands_,
                     &_force_flush_local->num_commands_,&_force_flush_local->num_literals_);
        }
        else {
          BrotliCreateBackwardReferences
                    ((ulong)data._4_4_,(ulong)(uint32_t)data,puStack_1360,(ulong)m._4_4_,storage,
                     &_force_flush_local->params,&_force_flush_local->hasher_,
                     _force_flush_local->dist_cache_,&_force_flush_local->last_insert_len_,
                     _force_flush_local->commands_ + _force_flush_local->num_commands_,
                     &_force_flush_local->num_commands_,&_force_flush_local->num_literals_,
                     _force_flush_local->backward_references_,
                     &_force_flush_local->back_refs_position_,_force_flush_local->back_refs_size_);
        }
        pBStack_50 = _force_flush_local;
        local_40 = _force_flush_local;
        local_34 = (_force_flush_local->params).lgwin;
        local_38 = (_force_flush_local->params).lgblock;
        local_149c = local_38;
        if (local_38 < local_34) {
          local_149c = local_34;
        }
        local_44 = local_149c + 1;
        local_48 = 0x18;
        local_14a0 = local_44;
        if (0x17 < local_44) {
          local_14a0 = 0x18;
        }
        local_54 = local_14a0;
        max_literals = 1L << ((byte)local_14a0 & 0x3f);
        max_commands = max_literals >> 3;
        processed_bytes = max_literals >> 3;
        lVar11 = _force_flush_local->input_pos_ - _force_flush_local->last_flush_pos_;
        _should_flush = lVar11;
        sVar7 = InputBlockSize(_force_flush_local);
        metablock_size = (uint32_t)(lVar11 + sVar7 <= max_literals);
        bVar12 = false;
        if ((_force_flush_local->params).quality < 4) {
          bVar12 = 0x2ffe < _force_flush_local->num_literals_ + _force_flush_local->num_commands_;
        }
        local_13d8 = (uint)bVar12;
        if (((((out_size_local._4_4_ == 0) && ((int)out_size_local == 0)) && (local_13d8 == 0)) &&
            ((metablock_size != 0 && (_force_flush_local->num_literals_ < max_commands)))) &&
           (_force_flush_local->num_commands_ < processed_bytes)) {
          iVar6 = UpdateLastProcessedPos(_force_flush_local);
          if (iVar6 != 0) {
            (_force_flush_local->hasher_).common.is_prepared_ = 0;
          }
          *output_local = (uint8_t *)0x0;
          s_local._0_4_ = 1;
        }
        else {
          if (_force_flush_local->last_insert_len_ != 0) {
            sVar7 = _force_flush_local->num_commands_;
            _force_flush_local->num_commands_ = sVar7 + 1;
            local_1278 = _force_flush_local->commands_ + sVar7;
            local_1280 = _force_flush_local->last_insert_len_;
            local_1278->insert_len_ = (uint32_t)local_1280;
            local_1278->copy_len_ = 0x8000000;
            local_1278->dist_extra_ = 0;
            local_1278->dist_prefix_ = 0x10;
            puStack_d0 = &local_1278->cmd_prefix_;
            local_c0 = 4;
            local_c4 = 0;
            if (local_1280 < 6) {
              local_9e = (ushort)local_1280;
            }
            else if (local_1280 < 0x82) {
              local_68 = local_1280 - 2;
              local_ac = 0x1f;
              if ((uint)local_68 != 0) {
                for (; (uint)local_68 >> local_ac == 0; local_ac = local_ac + -1) {
                }
              }
              local_ac = local_ac + -1;
              local_9e = (short)local_ac * 2 + (short)(local_1280 - 2 >> ((byte)local_ac & 0x3f)) +
                         2;
            }
            else if (local_1280 < 0x842) {
              local_60 = local_1280 - 0x42;
              iVar6 = 0x1f;
              if ((uint)local_60 != 0) {
                for (; (uint)local_60 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                }
              }
              local_9e = (short)iVar6 + 10;
            }
            else if (local_1280 < 0x1842) {
              local_9e = 0x15;
            }
            else if (local_1280 < 0x5842) {
              local_9e = 0x16;
            }
            else {
              local_9e = 0x17;
            }
            local_d2 = local_9e;
            uStack_98 = 4;
            local_8e = 2;
            local_d4 = 2;
            local_7c = local_9e;
            bits64 = 2;
            offset_9 = 0;
            local_86 = (local_9e & 7) << 3 | 2;
            local_8c = ((int)(uint)local_9e >> 3) * 0xc0 + 0x40 +
                       (0x520d40U >> ((char)((int)(uint)local_9e >> 3) * '\x06' & 0x1fU) & 0xc0);
            local_7a = (ushort)local_8c | local_86;
            *puStack_d0 = local_7a;
            _force_flush_local->num_literals_ =
                 _force_flush_local->last_insert_len_ + _force_flush_local->num_literals_;
            _force_flush_local->last_insert_len_ = 0;
            local_b8 = local_1280;
            uStack_a8 = local_1280;
          }
          if ((out_size_local._4_4_ == 0) &&
             (_force_flush_local->input_pos_ == _force_flush_local->last_flush_pos_)) {
            *output_local = (uint8_t *)0x0;
            s_local._0_4_ = 1;
          }
          else {
            storage_1._4_4_ =
                 (int)_force_flush_local->input_pos_ - (int)_force_flush_local->last_flush_pos_;
            storage_ix_1 = (size_t)GetBrotliStorage(_force_flush_local,
                                                    (ulong)(storage_1._4_4_ * 2 + 0x1f7));
            local_13f0 = (ulong)_force_flush_local->last_bytes_bits_;
            *(uint8_t *)storage_ix_1 = (uint8_t)_force_flush_local->last_bytes_;
            *(uint8_t *)(storage_ix_1 + 1) = (uint8_t)(_force_flush_local->last_bytes_ >> 8);
            WriteMetaBlockInternal
                      (pMStack_1370,puStack_1360,(ulong)m._4_4_,_force_flush_local->last_flush_pos_,
                       (ulong)storage_1._4_4_,out_size_local._4_4_,literal_context_lut._4_4_,
                       &_force_flush_local->params,_force_flush_local->prev_byte_,
                       _force_flush_local->prev_byte2_,_force_flush_local->num_literals_,
                       _force_flush_local->num_commands_,_force_flush_local->commands_,
                       _force_flush_local->saved_dist_cache_,_force_flush_local->dist_cache_,
                       &local_13f0,(uint8_t *)storage_ix_1,
                       _force_flush_local->literals_block_splits_decoder_,
                       &_force_flush_local->current_block_literals_,
                       _force_flush_local->cmds_block_splits_decoder_,
                       &_force_flush_local->current_block_cmds_);
            _force_flush_local->last_bytes_ = (ushort)*(byte *)(storage_ix_1 + (local_13f0 >> 3));
            _force_flush_local->last_bytes_bits_ = (byte)local_13f0 & 7;
            _force_flush_local->last_flush_pos_ = _force_flush_local->input_pos_;
            iVar6 = UpdateLastProcessedPos(_force_flush_local);
            if (iVar6 != 0) {
              (_force_flush_local->hasher_).common.is_prepared_ = 0;
            }
            if (_force_flush_local->last_flush_pos_ != 0) {
              _force_flush_local->prev_byte_ =
                   puStack_1360[(int)_force_flush_local->last_flush_pos_ - 1U & m._4_4_];
            }
            if (1 < _force_flush_local->last_flush_pos_) {
              _force_flush_local->prev_byte2_ =
                   puStack_1360[(int)_force_flush_local->last_flush_pos_ - 2U & m._4_4_];
            }
            _force_flush_local->num_commands_ = 0;
            _force_flush_local->num_literals_ = 0;
            *(undefined8 *)_force_flush_local->saved_dist_cache_ =
                 *(undefined8 *)_force_flush_local->dist_cache_;
            *(undefined8 *)(_force_flush_local->saved_dist_cache_ + 2) =
                 *(undefined8 *)(_force_flush_local->dist_cache_ + 2);
            *(size_t *)delta = storage_ix_1;
            *output_local = (uint8_t *)(local_13f0 >> 3);
            s_local._0_4_ = 1;
          }
        }
      }
    }
  }
  else {
    s_local._0_4_ = 0;
  }
  return (int)s_local;
LAB_0019154f:
  local_128 = local_128 + 1;
  limit2 = limit2 + 8;
  goto LAB_001914ed;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  uint32_t bytes = (uint32_t)delta;
  uint32_t wrapped_last_processed_pos = WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;
  ContextType literal_context_mode;
  ContextLut literal_context_lut;

  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->command_buf_) ||
        BROTLI_IS_NULL(s->literal_buf_)) {
      return BROTLI_FALSE;
    }
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_bytes_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 503);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_commands)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hasher_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);

  literal_context_mode = ChooseContextMode(
      &s->params, data, WrapPosition(s->last_flush_pos_),
      mask, (size_t)(s->input_pos_ - s->last_flush_pos_));
  literal_context_lut = BROTLI_CONTEXT_LUT(literal_context_mode);

  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->num_commands_ && s->last_insert_len_ == 0) {
    ExtendLastCommand(s, &bytes, &wrapped_last_processed_pos);
  }
  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BROTLI_DCHECK(s->params.hasher.type == 10);
    BrotliCreateHqZopfliBackwardReferences(m, bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(bytes, wrapped_last_processed_pos,
        data, mask, literal_context_lut, &s->params,
        &s->hasher_, s->dist_cache_,
        &s->last_insert_len_, &s->commands_[s->num_commands_],
        &s->num_commands_, &s->num_literals_, s->backward_references_,
        &s->back_refs_position_, s->back_refs_size_);
  }
  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HasherReset(&s->hasher_);
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  BROTLI_DCHECK(s->input_pos_ >= s->last_flush_pos_);
  BROTLI_DCHECK(s->input_pos_ > s->last_flush_pos_ || is_last);
  BROTLI_DCHECK(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 503);
    size_t storage_ix = s->last_bytes_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = (uint8_t)s->last_bytes_;
    storage[1] = (uint8_t)(s->last_bytes_ >> 8);
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        literal_context_mode, &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage, s->literals_block_splits_decoder_,
        &s->current_block_literals_, s->cmds_block_splits_decoder_,
        &s->current_block_cmds_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_bytes_ = (uint16_t)(storage[storage_ix >> 3]);
    s->last_bytes_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HasherReset(&s->hasher_);
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}